

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_update_image_dimensions(opj_image_t *p_image,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 OVar2;
  OPJ_INT32 OVar3;
  byte bVar4;
  long lVar5;
  char *fmt;
  uint uVar6;
  opj_image_comp_t *poVar7;
  
  poVar7 = p_image->comps;
  uVar6 = 0;
  while( true ) {
    if (p_image->numcomps <= uVar6) {
      return 1;
    }
    OVar1 = opj_int_ceildiv(p_image->x0,poVar7->dx);
    poVar7->x0 = OVar1;
    OVar1 = opj_int_ceildiv(p_image->y0,poVar7->dy);
    poVar7->y0 = OVar1;
    OVar2 = opj_int_ceildiv(p_image->x1,poVar7->dx);
    OVar3 = opj_int_ceildiv(p_image->y1,poVar7->dy);
    bVar4 = (byte)poVar7->factor;
    lVar5 = 1L << (bVar4 & 0x3f);
    OVar1 = (int)(lVar5 + OVar2 + -1 >> (bVar4 & 0x3f)) -
            (int)((int)poVar7->x0 + lVar5 + -1 >> (bVar4 & 0x3f));
    if ((int)OVar1 < 0) break;
    poVar7->w = OVar1;
    OVar1 = (int)(OVar3 + lVar5 + -1 >> (bVar4 & 0x3f)) -
            (int)((long)(int)poVar7->y0 + lVar5 + -1 >> (bVar4 & 0x3f));
    if ((int)OVar1 < 0) {
      fmt = "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n";
      goto LAB_00111174;
    }
    poVar7->h = OVar1;
    poVar7 = poVar7 + 1;
    uVar6 = uVar6 + 1;
  }
  fmt = "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n";
LAB_00111174:
  opj_event_msg(p_manager,1,fmt,(ulong)uVar6);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_update_image_dimensions(opj_image_t* p_image,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 it_comp;
    OPJ_INT32 l_comp_x1, l_comp_y1;
    opj_image_comp_t* l_img_comp = NULL;

    l_img_comp = p_image->comps;
    for (it_comp = 0; it_comp < p_image->numcomps; ++it_comp) {
        OPJ_INT32 l_h, l_w;

        l_img_comp->x0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->x0,
                         (OPJ_INT32)l_img_comp->dx);
        l_img_comp->y0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->y0,
                         (OPJ_INT32)l_img_comp->dy);
        l_comp_x1 = opj_int_ceildiv((OPJ_INT32)p_image->x1, (OPJ_INT32)l_img_comp->dx);
        l_comp_y1 = opj_int_ceildiv((OPJ_INT32)p_image->y1, (OPJ_INT32)l_img_comp->dy);

        l_w = opj_int_ceildivpow2(l_comp_x1, (OPJ_INT32)l_img_comp->factor)
              - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->x0, (OPJ_INT32)l_img_comp->factor);
        if (l_w < 0) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
                          it_comp, l_w);
            return OPJ_FALSE;
        }
        l_img_comp->w = (OPJ_UINT32)l_w;

        l_h = opj_int_ceildivpow2(l_comp_y1, (OPJ_INT32)l_img_comp->factor)
              - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->y0, (OPJ_INT32)l_img_comp->factor);
        if (l_h < 0) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
                          it_comp, l_h);
            return OPJ_FALSE;
        }
        l_img_comp->h = (OPJ_UINT32)l_h;

        l_img_comp++;
    }

    return OPJ_TRUE;
}